

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O3

bool __thiscall ON_SectionStyle::Read(ON_SectionStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  SectionBackgroundFillMode mode;
  SectionFillRule rule;
  SectionBackgroundFillMode SVar2;
  uchar item_id;
  int major_version;
  uint model_component_attributes_filter;
  int minor_version;
  uchar c;
  byte local_dd;
  int local_dc [3];
  ON_Linetype local_d0;
  
  ON_SectionStyle((ON_SectionStyle *)&local_d0);
  operator=(this,(ON_SectionStyle *)&local_d0);
  ~ON_SectionStyle((ON_SectionStyle *)&local_d0);
  local_dc[0] = 0;
  local_dc[2] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_dc,local_dc + 2);
  if (!bVar1) {
    return false;
  }
  if (local_dc[0] == 1) {
    local_dc[1] = 0;
    bVar1 = ON_BinaryArchive::ReadModelComponentAttributes
                      (file,&this->super_ON_ModelComponent,(uint *)(local_dc + 1));
    if (bVar1) {
      local_dd = 0;
      bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
      if (bVar1) {
        if (local_dd == 1) {
          local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
               (_func_int **)
               ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
               0xffffffffffffff00);
          bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
          if (!bVar1) goto LAB_005ac8ec;
          SVar2 = None;
          mode = ((byte)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object == '\x02')
                 + Viewport;
          if ((byte)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object == '\0') {
            mode = SVar2;
          }
          SetBackgroundFillMode(this,mode);
          bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
          if (!bVar1) goto LAB_005ac8ef;
        }
        if (local_dd == 2) {
          local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
               (_func_int **)
               CONCAT44(local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._4_4_,
                        ON_Color::UnsetColor.field_0);
          bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
          if (bVar1) {
            SetBackgroundFillColor(this,(ON_Color *)&local_d0,false);
            bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
            if (bVar1) {
              SetBackgroundFillColor(this,(ON_Color *)&local_d0,true);
              bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
              if (bVar1) goto LAB_005ac5f0;
            }
          }
        }
        else {
LAB_005ac5f0:
          if (local_dd == 3) {
            local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                 (_func_int **)
                 CONCAT71(local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._1_7_,1);
            bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&local_d0);
            if (bVar1) {
              SetBoundaryVisible(this,(bool)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                                  _vptr_ON_Object);
              bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
              if (bVar1) goto LAB_005ac632;
            }
          }
          else {
LAB_005ac632:
            if (local_dd == 4) {
              local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                   (_func_int **)
                   CONCAT44(local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._4_4_,
                            ON_Color::UnsetColor.field_0);
              bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
              if (bVar1) {
                SetBoundaryColor(this,(ON_Color *)&local_d0,false);
                bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
                if (bVar1) {
                  SetBoundaryColor(this,(ON_Color *)&local_d0,true);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                  if (bVar1) goto LAB_005ac6a6;
                }
              }
            }
            else {
LAB_005ac6a6:
              if (local_dd == 5) {
                local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                     (_func_int **)0x3ff0000000000000;
                bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&local_d0);
                if (bVar1) {
                  SetBoundaryWidthScale
                            (this,(double)local_d0.super_ON_ModelComponent.super_ON_Object.
                                          _vptr_ON_Object);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                  if (bVar1) goto LAB_005ac6f3;
                }
              }
              else {
LAB_005ac6f3:
                if (local_dd == 6) {
                  local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                       (_func_int **)
                       ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
                       0xffffffffffffff00);
                  bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_d0);
                  if (bVar1) {
                    rule = ON::SectionFillRuleFromUnsigned
                                     ((uint)(byte)local_d0.super_ON_ModelComponent.super_ON_Object.
                                                  _vptr_ON_Object);
                    SetSectionFillRule(this,rule);
                    bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                    if (bVar1) goto LAB_005ac73d;
                  }
                }
                else {
LAB_005ac73d:
                  if (local_dd == 7) {
                    local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                         (_func_int **)
                         ((ulong)local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
                         0xffffffff00000000);
                    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_d0);
                    if (bVar1) {
                      SetHatchIndex(this,(int)local_d0.super_ON_ModelComponent.super_ON_Object.
                                              _vptr_ON_Object);
                      bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                      if (bVar1) goto LAB_005ac781;
                    }
                  }
                  else {
LAB_005ac781:
                    if (local_dd == 8) {
                      local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                           (_func_int **)0x3ff0000000000000;
                      bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&local_d0);
                      if (bVar1) {
                        SetHatchScale(this,(double)local_d0.super_ON_ModelComponent.super_ON_Object.
                                                   _vptr_ON_Object);
                        bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                        if (bVar1) goto LAB_005ac7ce;
                      }
                    }
                    else {
LAB_005ac7ce:
                      if (local_dd == 9) {
                        local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                             (_func_int **)0x0;
                        bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&local_d0);
                        if (bVar1) {
                          SetHatchRotation(this,(double)local_d0.super_ON_ModelComponent.
                                                        super_ON_Object._vptr_ON_Object);
                          bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                          if (bVar1) goto LAB_005ac815;
                        }
                      }
                      else {
LAB_005ac815:
                        if (local_dd == 10) {
                          local_d0.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                               (_func_int **)
                               CONCAT44(local_d0.super_ON_ModelComponent.super_ON_Object.
                                        _vptr_ON_Object._4_4_,ON_Color::UnsetColor.field_0);
                          bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
                          if (bVar1) {
                            SetHatchColor(this,(ON_Color *)&local_d0,false);
                            bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_d0);
                            if (bVar1) {
                              SetHatchColor(this,(ON_Color *)&local_d0,true);
                              bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                              if (bVar1) goto LAB_005ac885;
                            }
                          }
                        }
                        else {
LAB_005ac885:
                          if (local_dd != 0xb) {
LAB_005ac8d4:
                            SVar2 = Viewport;
                            if (0xb < local_dd) {
                              local_dd = 0;
                            }
                            goto LAB_005ac8ef;
                          }
                          ON_Linetype::ON_Linetype(&local_d0);
                          bVar1 = ON_Linetype::Read(&local_d0,file);
                          if (bVar1) {
                            SetBoundaryLinetype(this,&local_d0);
                            bVar1 = ON_BinaryArchive::ReadChar(file,&local_dd);
                            ON_Linetype::~ON_Linetype(&local_d0);
                            if (bVar1) goto LAB_005ac8d4;
                          }
                          else {
                            ON_Linetype::~ON_Linetype(&local_d0);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_005ac8ec:
  SVar2 = None;
LAB_005ac8ef:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & SVar2);
}

Assistant:

bool ON_SectionStyle::Read( ON_BinaryArchive& file)
{
  *this = ON_SectionStyle();

  int major_version=0;
  int minor_version=0;
  if (!file.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version ))
    return false;

  bool rc = false;

  if ( 1 == major_version )
  {
    for (;;)
    {
      // chunk version 1.0 fields
      unsigned int model_component_attributes_filter = 0;
      if (!file.ReadModelComponentAttributes(*this,&model_component_attributes_filter))
        break;

      unsigned char item_id = 0;
      if (!file.ReadChar(&item_id))
        break;

      if (ON_SectionStyleTypeCodes::BackgroundFillMode == item_id) // 1
      {
        unsigned char c = 0;
        if (!file.ReadChar(&c))
          break;

        SectionBackgroundFillMode mode = SectionBackgroundFillModeFromUnsigned(c);
        SetBackgroundFillMode(mode);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BackgroundFillColor == item_id) // 2
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryVisible == item_id) // 3
      {
        bool b = true;
        if (!file.ReadBool(&b))
          break;
        SetBoundaryVisible(b);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryColor == item_id) // 4
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryWidthScale == item_id) // 5
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetBoundaryWidthScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::SectionFillRule == item_id) // 6
      {
        unsigned char rule = 0;
        if (!file.ReadChar(&rule))
          break;
        SetSectionFillRule(ON::SectionFillRuleFromUnsigned(rule));
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchIndex == item_id) // 7
      {
        int index = 0;
        if (!file.ReadInt(&index))
          break;
        SetHatchIndex(index);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchScale == item_id) // 8
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetHatchScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchRotation == item_id) // 9
      {
        double rotation = 0;
        if (!file.ReadDouble(&rotation))
          break;
        SetHatchRotation(rotation);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchColor == item_id) // 10
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryLinetype == item_id) // 11
      {
        ON_Linetype lt;
        if(!lt.Read(file))
          break;
        SetBoundaryLinetype(lt);
        if (!file.ReadChar(&item_id))
          break;
      }

      if (item_id > ON_SectionStyleTypeCodes::LastSectionStyleTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 0)
        item_id = 0;
      }

      rc = true;
      break;
    }
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}